

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynShortFunctionDefinition * ParseShortFunctionDefinition(ParseContext *ctx)

{
  IntrusiveList<SynShortFunctionArgument> arguments_00;
  bool bVar1;
  bool bVar2;
  Lexeme *pLVar3;
  Lexeme *end;
  SynShortFunctionArgument *pSVar4;
  SynBase *pSVar5;
  InplaceStr name_00;
  IntrusiveList<SynBase> IVar6;
  SynBase *body_1;
  SynBase *body;
  SynBase *local_a8;
  undefined1 local_a0 [8];
  IntrusiveList<SynBase> expressions;
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  SynBase *pSStack_50;
  bool hasName;
  SynBase *type;
  Lexeme *lexeme;
  Lexeme *pos;
  undefined1 auStack_30 [7];
  bool isFirst;
  IntrusiveList<SynShortFunctionArgument> arguments;
  Lexeme *start;
  ParseContext *ctx_local;
  
  arguments.tail = (SynShortFunctionArgument *)ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_less);
  if (bVar1) {
    IntrusiveList<SynShortFunctionArgument>::IntrusiveList
              ((IntrusiveList<SynShortFunctionArgument> *)auStack_30);
    bVar1 = true;
    do {
      if ((bVar1) && (bVar1 = ParseContext::At(ctx,lex_greater), bVar1)) break;
      bVar1 = false;
      lexeme = ctx->currentLexeme;
      pLVar3 = ctx->currentLexeme;
      pSStack_50 = ParseType(ctx,(bool *)0x0,false);
      bVar2 = ParseContext::At(ctx,lex_string);
      if (!bVar2) {
        ctx->currentLexeme = pLVar3;
        pSStack_50 = (SynBase *)0x0;
      }
      bVar2 = IntrusiveList<SynShortFunctionArgument>::empty
                        ((IntrusiveList<SynShortFunctionArgument> *)auStack_30);
      if (bVar2) {
        nameIdentifier._7_1_ =
             anon_unknown.dwarf_104b6::CheckAt
                       (ctx,lex_string,"ERROR: function argument name not found after \'<\'");
      }
      else {
        nameIdentifier._7_1_ =
             anon_unknown.dwarf_104b6::CheckAt
                       (ctx,lex_string,"ERROR: function argument name not found after \',\'");
      }
      if (nameIdentifier._7_1_ == false) {
        lexeme = ParseContext::Previous(ctx);
        name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
        InplaceStr::InplaceStr((InplaceStr *)&expressions.tail);
        SynIdentifier::SynIdentifier((SynIdentifier *)name.end,stack0xffffffffffffff70);
      }
      else {
        name_00 = ParseContext::Consume(ctx);
        name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
        pLVar3 = ParseContext::Previous(ctx);
        end = ParseContext::Previous(ctx);
        SynIdentifier::SynIdentifier((SynIdentifier *)name.end,pLVar3,end,name_00);
      }
      pSVar4 = ParseContext::get<SynShortFunctionArgument>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynShortFunctionArgument::SynShortFunctionArgument
                (pSVar4,lexeme,pLVar3,pSStack_50,(SynIdentifier *)name.end);
      IntrusiveList<SynShortFunctionArgument>::push_back
                ((IntrusiveList<SynShortFunctionArgument> *)auStack_30,pSVar4);
      bVar2 = ParseContext::Consume(ctx,lex_comma);
    } while (bVar2);
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' expected after short inline function argument list");
    IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)local_a0);
    bVar1 = ParseContext::Consume(ctx,lex_ofigure);
    if (bVar1) {
      IVar6 = ParseExpressions(ctx);
      body = IVar6.head;
      local_a0 = (undefined1  [8])body;
      local_a8 = IVar6.tail;
      expressions.head = local_a8;
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    }
    else {
      pSVar5 = ParseStatement(ctx);
      if (pSVar5 == (SynBase *)0x0) {
        pSVar5 = ParseAssignment(ctx);
        if (pSVar5 == (SynBase *)0x0) {
          pLVar3 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report
                    (ctx,pLVar3,"ERROR: expression not found after function header");
        }
        else {
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)local_a0,pSVar5);
        }
      }
      else {
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)local_a0,pSVar5);
      }
    }
    ctx_local = (ParseContext *)ParseContext::get<SynShortFunctionDefinition>(ctx);
    pSVar4 = arguments.tail;
    pLVar3 = ParseContext::Previous(ctx);
    arguments_00.tail = arguments.head;
    arguments_00.head = _auStack_30;
    IVar6.tail = expressions.head;
    IVar6.head = (SynBase *)local_a0;
    SynShortFunctionDefinition::SynShortFunctionDefinition
              ((SynShortFunctionDefinition *)ctx_local,(Lexeme *)pSVar4,pLVar3,arguments_00,IVar6);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynShortFunctionDefinition *)ctx_local;
}

Assistant:

SynShortFunctionDefinition* ParseShortFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_less))
	{
		IntrusiveList<SynShortFunctionArgument> arguments;

		bool isFirst = true;

		do
		{
			if(isFirst && ctx.At(lex_greater))
				break;

			isFirst = false;

			Lexeme *pos = ctx.currentLexeme;

			Lexeme *lexeme = ctx.currentLexeme;

			SynBase *type = ParseType(ctx);

			if(!ctx.At(lex_string))
			{
				// Backtrack
				ctx.currentLexeme = lexeme;

				type = NULL;
			}

			bool hasName = false;

			if(arguments.empty())
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after '<'");
			else
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after ','");

			SynIdentifier *nameIdentifier = NULL;

			if(hasName)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			arguments.push_back(new (ctx.get<SynShortFunctionArgument>()) SynShortFunctionArgument(pos, ctx.Previous(), type, nameIdentifier));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_greater, "ERROR: '>' expected after short inline function argument list");

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");
		}
		else if(SynBase *body = ParseStatement(ctx))
		{
			expressions.push_back(body);
		}
		else if(SynBase *body = ParseAssignment(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after function header");
		}

		return new (ctx.get<SynShortFunctionDefinition>()) SynShortFunctionDefinition(start, ctx.Previous(), arguments, expressions);
	}

	return NULL;
}